

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterMeshless.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChMatterMeshless::VariablesQbIncrementPosition(ChMatterMeshless *this,double dt_step)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  pointer psVar3;
  pointer psVar4;
  uint uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  ChStrainTensor<double> strainplasticflow;
  ChVector<double> local_88;
  double dStack_70;
  double dStack_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  MatrixBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  local_48 [24];
  
  psVar3 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar4 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar4 != psVar3) {
    uVar5 = 1;
    uVar6 = 0;
    do {
      peVar1 = psVar3[uVar6].
               super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      this_00 = psVar3[uVar6].
                super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      if (peVar1 == (element_type *)0x0) {
        __assert_fail("mnode",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChMatterMeshless.cpp"
                      ,0x25e,
                      "virtual void chrono::fea::ChMatterMeshless::VariablesQbIncrementPosition(double)"
                     );
      }
      dStack_68 = 0.0;
      dStack_60 = 0.0;
      local_88.m_data[0] = 0.0;
      local_88.m_data[1] = 0.0;
      local_88.m_data[2] = 0.0;
      dStack_70 = 0.0;
      peVar2 = (this->material).
               super___shared_ptr<chrono::fea::ChContinuumElastoplastic,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      peVar1 = (this->nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar6].
               super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      dVar7 = 0.0;
      (*(peVar2->super_ChContinuumElastic).super_ChContinuumMaterial._vptr_ChContinuumMaterial[6])
                (peVar2,&local_88,&peVar1->t_strain,&peVar1->e_strain,&peVar1->p_strain);
      (*(((this->material).
          super___shared_ptr<chrono::fea::ChContinuumElastoplastic,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->super_ChContinuumElastic).super_ChContinuumMaterial._vptr_ChContinuumMaterial[8])
                ();
      peVar1 = (this->nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar6].
               super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = dVar7 * dt_step;
      auVar9 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar9);
      dVar8 = auVar9._0_8_;
      dVar7 = (peVar1->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1]
      ;
      *(double *)&(peVar1->p_strain).super_ChVoightTensor<double> =
           dVar8 * local_88.m_data[0] + *(double *)&(peVar1->p_strain).super_ChVoightTensor<double>;
      (peVar1->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
           dVar8 * local_88.m_data[1] + dVar7;
      dVar7 = (peVar1->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3]
      ;
      (peVar1->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
           dVar8 * local_88.m_data[2] +
           (peVar1->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
      (peVar1->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
           dVar8 * dStack_70 + dVar7;
      dVar7 = (peVar1->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5]
      ;
      (peVar1->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
           dVar8 * dStack_68 +
           (peVar1->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
      (peVar1->p_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
           dVar8 * dStack_60 + dVar7;
      peVar1 = (this->nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar6].
               super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      dVar7 = (peVar1->super_ChNodeXYZ).pos.m_data[1];
      (peVar1->pos_ref).m_data[0] = (peVar1->super_ChNodeXYZ).pos.m_data[0];
      (peVar1->pos_ref).m_data[1] = dVar7;
      (peVar1->pos_ref).m_data[2] = (peVar1->super_ChNodeXYZ).pos.m_data[2];
      dVar7 = (peVar1->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1]
      ;
      dVar8 = (peVar1->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1]
      ;
      *(double *)&(peVar1->e_strain).super_ChVoightTensor<double> =
           *(double *)&(peVar1->t_strain).super_ChVoightTensor<double> +
           *(double *)&(peVar1->e_strain).super_ChVoightTensor<double>;
      (peVar1->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
           dVar7 + dVar8;
      dVar7 = (peVar1->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3]
      ;
      dVar8 = (peVar1->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3]
      ;
      (peVar1->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
           (peVar1->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] +
           (peVar1->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
      (peVar1->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
           dVar7 + dVar8;
      dVar7 = (peVar1->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5]
      ;
      dVar8 = (peVar1->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5]
      ;
      (peVar1->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
           (peVar1->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] +
           (peVar1->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
      (peVar1->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
           dVar7 + dVar8;
      psVar3 = (this->nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      peVar1 = psVar3[uVar6].
               super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (peVar1->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
      (peVar1->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
      (peVar1->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
      (peVar1->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
      (peVar1->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0;
      (peVar1->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
      (peVar1->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
      (peVar1->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        psVar3 = (this->nodes).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      psVar4 = (this->nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar6 = (ulong)uVar5;
      uVar5 = uVar5 + 1;
    } while (uVar6 < (ulong)((long)psVar4 - (long)psVar3 >> 4));
  }
  if (psVar4 != psVar3) {
    uVar5 = 1;
    uVar6 = 0;
    local_58 = dt_step;
    dStack_50 = dt_step;
    do {
      ChVariables::Get_qb((ChVectorRef *)local_48,
                          &((psVar3[uVar6].
                             super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->variables).super_ChVariables);
      ChVector<double>::
      ChVector<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
                (&local_88,local_48,(type *)0x0);
      psVar3 = (this->nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      peVar1 = psVar3[uVar6].
               super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar6 = (ulong)uVar5;
      uVar5 = uVar5 + 1;
      dVar7 = (peVar1->super_ChNodeXYZ).pos.m_data[2];
      dVar8 = (peVar1->super_ChNodeXYZ).pos.m_data[1];
      (peVar1->super_ChNodeXYZ).pos.m_data[0] =
           local_58 * local_88.m_data[0] + (peVar1->super_ChNodeXYZ).pos.m_data[0];
      (peVar1->super_ChNodeXYZ).pos.m_data[1] = dStack_50 * local_88.m_data[1] + dVar8;
      (peVar1->super_ChNodeXYZ).pos.m_data[2] = dt_step * local_88.m_data[2] + dVar7;
    } while (uVar6 < (ulong)((long)(this->nodes).
                                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4));
  }
  return;
}

Assistant:

void ChMatterMeshless::VariablesQbIncrementPosition(double dt_step) {
    // if (!IsActive())
    //	return;

    for (unsigned int j = 0; j < nodes.size(); j++) {
        std::shared_ptr<ChNodeMeshless> mnode(nodes[j]);
        assert(mnode);

        // Integrate plastic flow
        ChStrainTensor<> strainplasticflow;
        material->ComputeReturnMapping(strainplasticflow,   // dEp, flow of elastic strain (correction)
                                       nodes[j]->t_strain,  // increment of total strain
                                       nodes[j]->e_strain,  // last elastic strain
                                       nodes[j]->p_strain   // last plastic strain
                                       );
        double dtpfact = dt_step * material->Get_flow_rate();
        if (dtpfact > 1.0)
            dtpfact = 1.0;  // clamp if dt is larger than plastic flow duration

        nodes[j]->p_strain += strainplasticflow * dtpfact;

        // Increment total elastic tensor and proceed for next step
        nodes[j]->pos_ref = nodes[j]->pos;
        nodes[j]->e_strain += nodes[j]->t_strain;
        //	nodes[j]->e_strain.MatrDec(strainplasticflow*dtpfact);
        nodes[j]->t_strain.setZero();  // unuseful? will be overwritten anyway
    }

    for (unsigned int j = 0; j < nodes.size(); j++) {
        // Updates position with incremental action of speed contained in the
        // 'qb' vector:  pos' = pos + dt * speed   , like in an Eulero step.

        ChVector<> newspeed(nodes[j]->variables.Get_qb());

        // ADVANCE POSITION: pos' = pos + dt * vel
        nodes[j]->SetPos(nodes[j]->GetPos() + newspeed * dt_step);
    }
}